

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall
helics::CommonCore::routeMessage(CommonCore *this,ActionMessage *cmd,GlobalFederateId dest)

{
  GlobalBrokerId id;
  bool bVar1;
  FederateStates FVar2;
  GlobalFederateId GVar3;
  route_id rVar4;
  FederateState *action;
  BaseType in_EDX;
  long in_RSI;
  ActionMessage *in_RDI;
  route_id route;
  optional<helics::ActionMessage> rep;
  FederateState *fed;
  ActionMessage *in_stack_00000178;
  CommonCore *in_stack_00000180;
  ActionMessage *in_stack_00000368;
  TranslatorFederate *in_stack_00000370;
  ActionMessage *in_stack_00000478;
  FilterFederate *in_stack_00000480;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  CommonCore *in_stack_fffffffffffffef8;
  GlobalFederateId in_stack_ffffffffffffff00;
  CommonCore *in_stack_ffffffffffffff08;
  GlobalFederateId in_stack_ffffffffffffff14;
  CommonCore *in_stack_ffffffffffffff18;
  GlobalFederateId in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffffc8;
  GlobalFederateId local_4;
  
  local_4.gid = in_EDX;
  bVar1 = GlobalFederateId::isValid(&local_4);
  if (bVar1) {
    *(BaseType *)(in_RSI + 0x10) = local_4.gid;
    bVar1 = GlobalFederateId::operator==(&local_4,(GlobalBrokerId)0x0);
    if ((bVar1) ||
       (id.gid._0_2_ = in_RDI->counter, id.gid._2_2_ = in_RDI->flags,
       bVar1 = GlobalFederateId::operator==(&local_4,id), bVar1)) {
      (**(code **)(*(long *)in_RDI + 0x358))(in_RDI,0,in_RSI);
    }
    else {
      bVar1 = GlobalFederateId::operator==(&local_4,(GlobalBrokerId)(in_RDI->dest_handle).hid);
      if (bVar1) {
        processCommandsForCore(in_stack_00000180,in_stack_00000178);
      }
      else {
        GVar3 = std::atomic::operator_cast_to_GlobalFederateId
                          ((atomic<helics::GlobalFederateId> *)in_RDI);
        bVar1 = GlobalFederateId::operator==(&local_4,GVar3);
        if (bVar1) {
          FilterFederate::handleMessage(in_stack_00000480,in_stack_00000478);
        }
        else {
          GVar3 = std::atomic::operator_cast_to_GlobalFederateId
                            ((atomic<helics::GlobalFederateId> *)in_RDI);
          bVar1 = GlobalFederateId::operator==(&local_4,GVar3);
          if (bVar1) {
            TranslatorFederate::handleMessage(in_stack_00000370,in_stack_00000368);
          }
          else {
            bVar1 = isLocal(in_stack_ffffffffffffff08,in_stack_ffffffffffffff14);
            if (bVar1) {
              action = getFederateCore(in_stack_ffffffffffffff18,in_stack_ffffffffffffff24);
              if (action != (FederateState *)0x0) {
                FVar2 = FederateState::getState((FederateState *)0x487000);
                if (FVar2 == FINISHED) {
                  FederateState::processPostTerminationAction
                            ((FederateState *)CONCAT44(local_4.gid,in_stack_ffffffffffffffc8),
                             (ActionMessage *)action);
                  bVar1 = std::optional::operator_cast_to_bool
                                    ((optional<helics::ActionMessage> *)0x48703f);
                  if (bVar1) {
                    std::optional<helics::ActionMessage>::operator*
                              ((optional<helics::ActionMessage> *)0x48704f);
                    routeMessage(in_stack_00000180,in_stack_00000178);
                  }
                  std::optional<helics::ActionMessage>::~optional
                            ((optional<helics::ActionMessage> *)0x487083);
                }
                else {
                  FederateState::addAction
                            ((FederateState *)
                             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),in_RDI);
                }
              }
            }
            else {
              rVar4 = getRoute(in_stack_fffffffffffffef8,in_stack_ffffffffffffff00);
              (**(code **)(*(long *)in_RDI + 0x358))(in_RDI,rVar4.rid,in_RSI);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void CommonCore::routeMessage(ActionMessage& cmd, GlobalFederateId dest)
{
    if (!dest.isValid()) {
        return;
    }
    cmd.dest_id = dest;
    if ((dest == parent_broker_id) || (dest == higher_broker_id)) {
        transmit(parent_route_id, cmd);
    } else if (dest == global_broker_id_local) {
        processCommandsForCore(cmd);
    } else if (dest == filterFedID) {
        filterFed->handleMessage(cmd);
    } else if (dest == translatorFedID) {
        translatorFed->handleMessage(cmd);
    } else if (isLocal(dest)) {
        auto* fed = getFederateCore(dest);
        if (fed != nullptr) {
            if (fed->getState() != FederateStates::FINISHED) {
                fed->addAction(cmd);
            } else {
                auto rep = fed->processPostTerminationAction(cmd);
                if (rep) {
                    routeMessage(*rep);
                }
            }
        }
    } else {
        auto route = getRoute(dest);
        transmit(route, cmd);
    }
}